

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O2

DaysInYear days_since_jan(long days)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = 0x7b1;
  do {
    lVar3 = days;
    lVar2 = lVar2 + 1;
    bVar1 = leapyear((int)lVar2);
    days = lVar3 - ((ulong)bVar1 + 0x16d);
  } while ((long)((ulong)bVar1 + 0x16d) <= lVar3);
  return (DaysInYear)((lVar3 << 0x20) + lVar2);
}

Assistant:

DaysInYear days_since_jan(long days)
{
	auto year = 1970;
	auto d{ days };
	while (true)
	{
		auto threshold = leapyear(year) ? 366 : 365;
		if (d < threshold)
			break;
		d -= threshold;
		++year;
	}
	return DaysInYear(year, d);
}